

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ST2052_TextParser.cpp
# Opt level: O0

Type5UUIDFilenameResolver * __thiscall
AS_02::TimedText::Type5UUIDFilenameResolver::OpenRead
          (Type5UUIDFilenameResolver *this,string *dirname)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  char in_DL;
  pair<std::_Rb_tree_iterator<std::pair<const_Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar4;
  pair<const_Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a0;
  string local_360;
  undefined1 local_340 [8];
  UUID asset_id_1;
  string local_318 [32];
  string local_2f8 [8];
  string font_root_name;
  pair<const_Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c8;
  string local_288;
  undefined1 local_268 [8];
  UUID asset_id;
  string local_1e0 [8];
  Result_t read_result;
  FileReader local_178 [8];
  FileReader reader;
  string local_148 [8];
  string tmp_path;
  long local_b8;
  byte_t read_buffer [16];
  string local_90 [8];
  string abs_dirname;
  string next_item;
  DirScannerEx local_48 [4];
  DirectoryEntryType_t ft;
  DirScannerEx dir_reader;
  string *dirname_local;
  Type5UUIDFilenameResolver *this_local;
  Result_t *result;
  
  Kumu::DirScannerEx::DirScannerEx(local_48);
  std::__cxx11::string::string((string *)(abs_dirname.field_2._M_local_buf + 8));
  Kumu::PathMakeCanonical(local_90,in_DL);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::__cxx11::string::operator=(local_90,".");
  }
  Kumu::DirScannerEx::Open((string *)this);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    while( true ) {
      Kumu::DirScannerEx::GetNext
                ((string *)(tmp_path.field_2._M_local_buf + 8),(DirectoryEntryType_t *)local_48);
      iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)(tmp_path.field_2._M_local_buf + 8));
      Kumu::Result_t::~Result_t((Result_t *)(tmp_path.field_2._M_local_buf + 8));
      if (iVar1 < 0) break;
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)((long)&abs_dirname.field_2 + 8));
      if (*pcVar3 != '.') {
        Kumu::PathJoin(local_148,local_90,(char)&abs_dirname + '\x18');
        if (next_item.field_2._12_4_ == 0) {
          Kumu::FileReader::FileReader(local_178);
          Kumu::FileReader::OpenRead(local_1e0);
          iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_1e0);
          if (-1 < iVar1) {
            Kumu::FileReader::Read
                      (asset_id.super_Identifier<16U>.m_Value + 0xf,(uint)local_178,
                       (uint *)&local_b8);
            Kumu::Result_t::operator=
                      ((Result_t *)local_1e0,
                       (Result_t *)(asset_id.super_Identifier<16U>.m_Value + 0xf));
            Kumu::Result_t::~Result_t((Result_t *)(asset_id.super_Identifier<16U>.m_Value + 0xf));
          }
          iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_1e0);
          if (-1 < iVar1) {
            if (local_b8 == 0xa1a0a0d474e5089) {
              Kumu::PathBasename((string *)&local_288,(char)&abs_dirname + '\x18');
              CreatePNGNameId((UUID *)local_268,&local_288);
              std::__cxx11::string::~string((string *)&local_288);
              std::
              pair<const_Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              pair<Kumu::UUID_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                        (&local_2c8,(UUID *)local_268,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&abs_dirname.field_2 + 8));
              pVar4 = std::
                      map<Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::insert((map<Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&dirname->_M_string_length,&local_2c8);
              font_root_name.field_2._8_8_ = pVar4.first._M_node;
              std::
              pair<const_Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair(&local_2c8);
              Kumu::UUID::~UUID((UUID *)local_268);
            }
            else {
              iVar1 = memcmp(&local_b8,"OTTO",5);
              if ((iVar1 == 0) || (iVar1 = memcmp(&local_b8,"",5), iVar1 == 0)) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (local_318,"",
                           (allocator<char> *)&asset_id_1.super_Identifier<16U>.field_0x1f);
                Kumu::PathSetExtension(local_2f8,(string *)(abs_dirname.field_2._M_local_buf + 8));
                std::__cxx11::string::~string(local_318);
                std::allocator<char>::~allocator
                          ((allocator<char> *)&asset_id_1.super_Identifier<16U>.field_0x1f);
                Kumu::PathBasename((string *)&local_360,(char)local_2f8);
                CreateFontNameId((UUID *)local_340,&local_360);
                std::__cxx11::string::~string((string *)&local_360);
                std::
                pair<const_Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::
                pair<Kumu::UUID_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                          (&local_3a0,(UUID *)local_340,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&abs_dirname.field_2 + 8));
                std::
                map<Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::insert((map<Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&dirname->_M_string_length,&local_3a0);
                std::
                pair<const_Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~pair(&local_3a0);
                Kumu::UUID::~UUID((UUID *)local_340);
                std::__cxx11::string::~string(local_2f8);
              }
            }
          }
          Kumu::Result_t::~Result_t((Result_t *)local_1e0);
          Kumu::FileReader::~FileReader(local_178);
        }
        std::__cxx11::string::~string(local_148);
      }
    }
  }
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)(abs_dirname.field_2._M_local_buf + 8));
  Kumu::DirScannerEx::~DirScannerEx(local_48);
  return this;
}

Assistant:

Result_t
AS_02::TimedText::Type5UUIDFilenameResolver::OpenRead(const std::string& dirname)
{
  DirScannerEx dir_reader;
  DirectoryEntryType_t ft;
  std::string next_item;
  std::string abs_dirname = PathMakeCanonical(dirname);
  byte_t read_buffer[16];

  if ( abs_dirname.empty() )
    {
      abs_dirname = ".";
    }

  Result_t result = dir_reader.Open(abs_dirname);

  if ( KM_SUCCESS(result) )
    {
      while ( KM_SUCCESS(dir_reader.GetNext(next_item, ft)) )
        {
          if ( next_item[0] == '.' ) continue; // no hidden files
	  std::string tmp_path = PathJoin(abs_dirname, next_item);

	  if ( ft == DET_FILE )
	    {
	      FileReader reader;
	      Result_t read_result = reader.OpenRead(tmp_path);

	      if ( KM_SUCCESS(read_result) )
		{
		  read_result = reader.Read(read_buffer, 16);
		}

	      if ( KM_SUCCESS(read_result) )
		{
		  // is it PNG?
		  if ( memcmp(read_buffer, PNGMagic, sizeof(PNGMagic)) == 0 )
		    {
		      UUID asset_id = CreatePNGNameId(PathBasename(next_item));
		      m_ResourceMap.insert(ResourceMap::value_type(asset_id, next_item));
		    }
		  // is it a font?
		  else if ( memcmp(read_buffer, OpenTypeMagic, sizeof(OpenTypeMagic)) == 0
			    || memcmp(read_buffer, TrueTypeMagic, sizeof(TrueTypeMagic)) == 0 )
		    {
		      std::string font_root_name = PathSetExtension(next_item, "");
		      UUID asset_id = CreateFontNameId(PathBasename(font_root_name));
		      m_ResourceMap.insert(ResourceMap::value_type(asset_id, next_item));
		    }
		}
	    }
	}
    }

  return result;
}